

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::mask_blit_dst
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t r,uint64_t g,uint64_t b)

{
  long y_00;
  long x_00;
  long lVar1;
  ssize_t x_01;
  bool bVar2;
  uint64_t _b;
  uint64_t local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  ssize_t local_90;
  ssize_t local_88;
  ssize_t local_80;
  long local_78;
  ssize_t local_70;
  ssize_t local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  ssize_t local_40;
  ssize_t local_38;
  
  local_88 = w;
  if (w < 0) {
    local_88 = source->width;
  }
  local_90 = h;
  if (h < 0) {
    local_90 = source->height;
  }
  local_40 = y;
  local_38 = x;
  clamp_blit_dimensions(this,source,&local_38,&local_40,&local_88,&local_90,&sx,&sy);
  local_68 = local_38;
  local_70 = local_40;
  local_78 = sx;
  local_50 = 0;
  local_60 = local_88;
  if (local_88 < 1) {
    local_60 = local_50;
  }
  local_80 = sy;
  local_58 = local_90;
  if (local_90 < 1) {
    local_58 = local_50;
  }
  for (; local_50 != local_58; local_50 = local_50 + 1) {
    y_00 = local_70 + local_50;
    local_48 = local_80 + local_50;
    x_00 = local_78;
    lVar1 = local_60;
    x_01 = local_68;
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      read_pixel(this,x_01,y_00,&local_a8,&local_b0,&local_98,&local_a0);
      if (((local_a8 == r) && (local_b0 == g)) && (local_98 == b)) {
        read_pixel(source,x_00,local_48,&local_a8,&local_b0,&local_98,&local_a0);
        write_pixel(this,x_01,y_00,local_a8,local_b0,local_98,local_a0);
      }
      x_01 = x_01 + 1;
      x_00 = x_00 + 1;
    }
  }
  return;
}

Assistant:

void Image::mask_blit_dst(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t r, uint64_t g, uint64_t b) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t _r, _g, _b, _a;
      this->read_pixel(x + xx, y + yy, &_r, &_g, &_b, &_a);
      if (r == _r && g == _g && b == _b) {
        source.read_pixel(sx + xx, sy + yy, &_r, &_g, &_b, &_a);
        this->write_pixel(x + xx, y + yy, _r, _g, _b, _a);
      }
    }
  }
}